

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

int32_t uhash_iputi_63(UHashtable *hash,int32_t key,int32_t value,UErrorCode *status)

{
  UHashTok UVar1;
  UHashTok key_00;
  
  key_00._4_4_ = 0;
  key_00.integer = key;
  UVar1._4_4_ = 0;
  UVar1.integer = value;
  UVar1 = _uhash_put(hash,key_00,UVar1,'\0',status);
  return UVar1._0_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uhash_iputi(UHashtable *hash,
           int32_t key,
           int32_t value,
           UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.integer = key;
    valueholder.integer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      0, /* neither is a ptr */
                      status).integer;
}